

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbvthandler.cpp
# Opt level: O2

void setTTYCursor(bool enable)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  char **dev;
  undefined1 *puVar6;
  long in_FS_OFFSET;
  undefined1 auStack_48 [8];
  char *local_40 [3];
  long local_28;
  
  puVar6 = auStack_48;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (setTTYCursor(bool)::ignore == '\0') {
    iVar2 = __cxa_guard_acquire(&setTTYCursor(bool)::ignore);
    if (iVar2 != 0) {
      iVar2 = qEnvironmentVariableIntValue("QT_QPA_PRESERVE_CONSOLE_STATE",(bool *)0x0);
      setTTYCursor::ignore = iVar2 != 0;
      __cxa_guard_release(&setTTYCursor(bool)::ignore);
    }
  }
  if (setTTYCursor::ignore == false) {
    local_40[0] = "/dev/tty";
    local_40[1] = "/dev/console";
    local_40[2] = (char *)0x0;
    pcVar5 = "/dev/tty0";
    while (pcVar5 != (char *)0x0) {
      do {
        iVar2 = open64(pcVar5,0x80002,0x1ff);
        if (iVar2 != -1) {
          pcVar5 = "\x1b[9;0]\x1b[?33l\x1b[?25l\x1b[?1c";
          if (enable) {
            pcVar5 = "\x1b[9;15]\x1b[?33h\x1b[?25h\x1b[?0c";
          }
          qt_safe_write(iVar2,pcVar5,(ulong)enable | 0x18);
          goto LAB_0011c0c4;
        }
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
      puVar1 = (undefined8 *)(puVar6 + 8);
      puVar6 = puVar6 + 8;
      pcVar5 = (char *)*puVar1;
    }
  }
  goto LAB_0011c0da;
  while( true ) {
    piVar4 = __errno_location();
    if (*piVar4 != 4) break;
LAB_0011c0c4:
    iVar3 = close(iVar2);
    if (iVar3 != -1) break;
  }
LAB_0011c0da:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void setTTYCursor(bool enable)
{
    static bool ignore = qEnvironmentVariableIntValue("QT_QPA_PRESERVE_CONSOLE_STATE");
    if (ignore)
        return;

    const char * const devs[] = { "/dev/tty0", "/dev/tty", "/dev/console", 0 };
    int fd = -1;
    for (const char * const *dev = devs; *dev; ++dev) {
        fd = QT_OPEN(*dev, O_RDWR);
        if (fd != -1) {
            // Enable/disable screen blanking and the blinking cursor.
            const char *termctl = enable ? "\033[9;15]\033[?33h\033[?25h\033[?0c" : "\033[9;0]\033[?33l\033[?25l\033[?1c";
            QT_WRITE(fd, termctl, strlen(termctl) + 1);
            QT_CLOSE(fd);
            return;
        }
    }
}